

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::SetExpressionResponse>::construct
          (BasicTypeInfo<dap::SetExpressionResponse> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::SetExpressionResponse> *this_local;
  
  memset(ptr,0,0xf8);
  SetExpressionResponse::SetExpressionResponse((SetExpressionResponse *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }